

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

void __thiscall sf::Text::Text(Text *this)

{
  Drawable *in_RDI;
  VertexArray *unaff_retaddr;
  Transformable *in_stack_ffffffffffffffc0;
  Drawable *pDVar1;
  VertexBuffer *this_00;
  size_t in_stack_fffffffffffffff0;
  PrimitiveType type;
  
  pDVar1 = in_RDI;
  Drawable::Drawable(in_RDI);
  type = (PrimitiveType)((ulong)pDVar1 >> 0x20);
  Transformable::Transformable(in_stack_ffffffffffffffc0);
  in_RDI->_vptr_Drawable = (_func_int **)&PTR__Text_001d7768;
  in_RDI[1]._vptr_Drawable = (_func_int **)&PTR__Text_001d7790;
  String::String((String *)0x16b0d3);
  in_RDI[0x1b]._vptr_Drawable = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[0x1c]._vptr_Drawable = 0x1e;
  *(undefined4 *)((long)&in_RDI[0x1c]._vptr_Drawable + 4) = 0x3f800000;
  *(undefined4 *)&in_RDI[0x1d]._vptr_Drawable = 0x3f800000;
  *(undefined4 *)((long)&in_RDI[0x1d]._vptr_Drawable + 4) = 0;
  Color::Color((Color *)(in_RDI + 0x1e),0xff,0xff,0xff,0xff);
  Color::Color((Color *)((long)&in_RDI[0x1e]._vptr_Drawable + 4),'\0','\0','\0',0xff);
  *(undefined4 *)&in_RDI[0x1f]._vptr_Drawable = 0;
  this_00 = (VertexBuffer *)(in_RDI + 0x20);
  VertexArray::VertexArray(unaff_retaddr,type,in_stack_fffffffffffffff0);
  pDVar1 = in_RDI + 0x25;
  VertexArray::VertexArray(unaff_retaddr,type,in_stack_fffffffffffffff0);
  VertexBuffer::VertexBuffer(this_00,(PrimitiveType)((ulong)pDVar1 >> 0x20),(Usage)pDVar1);
  VertexBuffer::VertexBuffer(this_00,(PrimitiveType)((ulong)pDVar1 >> 0x20),(Usage)pDVar1);
  Rect<float>::Rect((Rect<float> *)(in_RDI + 0x32));
  *(undefined1 *)&in_RDI[0x34]._vptr_Drawable = 0;
  in_RDI[0x35]._vptr_Drawable = (_func_int **)0x0;
  return;
}

Assistant:

Text::Text() :
m_string               (),
m_font                 (NULL),
m_characterSize        (30),
m_letterSpacingFactor  (1.f),
m_lineSpacingFactor    (1.f),
m_style                (Regular),
m_fillColor            (255, 255, 255),
m_outlineColor         (0, 0, 0),
m_outlineThickness     (0),
m_vertices             (Triangles),
m_outlineVertices      (Triangles),
m_verticesBuffer       (Triangles, VertexBuffer::Static),
m_outlineVerticesBuffer(Triangles, VertexBuffer::Static),
m_bounds               (),
m_geometryNeedUpdate   (false),
m_fontTextureId        (0)
{

}